

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

htmlDocPtr htmlReadFd(int fd,char *url,char *encoding,int options)

{
  htmlParserCtxtPtr ctxt;
  xmlParserInputPtr input;
  htmlDocPtr pxVar1;
  
  pxVar1 = (htmlDocPtr)0x0;
  ctxt = htmlNewSAXParserCtxt((htmlSAXHandler *)0x0,(void *)0x0);
  if (ctxt != (htmlParserCtxtPtr)0x0) {
    htmlCtxtSetOptionsInternal(ctxt,options,0x692064);
    pxVar1 = (htmlDocPtr)0x0;
    input = xmlCtxtNewInputFromFd(ctxt,url,fd,encoding,0);
    if (input != (xmlParserInputPtr)0x0) {
      pxVar1 = htmlCtxtParseDocument(ctxt,input);
    }
    xmlFreeParserCtxt(ctxt);
  }
  return pxVar1;
}

Assistant:

htmlDocPtr
htmlReadFd(int fd, const char *url, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    htmlDocPtr doc = NULL;

    ctxt = htmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    htmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromFd(ctxt, url, fd, encoding, 0);

    if (input != NULL)
        doc = htmlCtxtParseDocument(ctxt, input);

    htmlFreeParserCtxt(ctxt);
    return(doc);
}